

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Runtime.cpp
# Opt level: O0

void __thiscall runtime::VirtualMachine::LoadLocal(VirtualMachine *this)

{
  bool bVar1;
  element_type *peVar2;
  size_t sVar3;
  size_type sVar4;
  reference pvVar5;
  Variable v;
  Variable local;
  allocator<char> local_89;
  string local_88;
  size_type local_68;
  size_t index;
  vector<runtime::Variable,_std::allocator<runtime::Variable>_> *locals;
  shared_ptr<runtime::StackFrame> stackFrame;
  allocator<char> local_31;
  string local_30;
  VirtualMachine *local_10;
  VirtualMachine *this_local;
  
  local_10 = this;
  bVar1 = std::operator==(&this->stackFrame,(nullptr_t)0x0);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_30,"No stack frame found in LoadLocal",&local_31);
    panic(this,&local_30);
  }
  std::shared_ptr<runtime::StackFrame>::shared_ptr
            ((shared_ptr<runtime::StackFrame> *)&locals,&this->stackFrame);
  peVar2 = std::__shared_ptr_access<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&locals);
  index = (size_t)&peVar2->locals;
  sVar3 = getByteCodeParameter(this);
  local_68 = sVar3;
  sVar4 = std::vector<runtime::Variable,_std::allocator<runtime::Variable>_>::size
                    ((vector<runtime::Variable,_std::allocator<runtime::Variable>_> *)index);
  if (sVar4 <= sVar3) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_88,"Index out of bounds in LoadLocal",&local_89);
    panic(this,&local_88);
  }
  pvVar5 = std::vector<runtime::Variable,_std::allocator<runtime::Variable>_>::at
                     ((vector<runtime::Variable,_std::allocator<runtime::Variable>_> *)index,
                      local_68);
  v._0_8_ = *(ulong *)pvVar5 & 0xffffffff;
  v.field_1.integerValue = (pvVar5->field_1).integerValue;
  pushOpStack(this,v);
  advance(this);
  std::shared_ptr<runtime::StackFrame>::~shared_ptr((shared_ptr<runtime::StackFrame> *)&locals);
  return;
}

Assistant:

void runtime::VirtualMachine::LoadLocal() {
  if (this->stackFrame == nullptr) {
    this->panic("No stack frame found in LoadLocal");
    return;
  }

  auto stackFrame = this->stackFrame;

  auto locals = &stackFrame->locals;

  auto index = this->getByteCodeParameter();

  if (index >= locals->size()) {
    this->panic("Index out of bounds in LoadLocal");
    return;
  }

  Variable local = locals->at(index);

  this->pushOpStack(local);

  this->advance();
}